

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O1

void __thiscall
FactorTimer::reportFactorLevel1Clock(FactorTimer *this,HighsTimerClock *factor_timer_clock)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> factor_clock_list;
  allocator_type local_69;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_50;
  int local_38 [8];
  
  local_38[4] = 6;
  local_38[5] = 0xb;
  local_38[6] = 0x1a;
  local_38[7] = 0x1f;
  local_38[0] = 1;
  local_38[1] = 2;
  local_38[2] = 3;
  local_38[3] = 4;
  __l._M_len = 8;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,&local_69);
  std::vector<int,_std::allocator<int>_>::vector(&local_68,&local_50);
  reportFactorClockList(this,"FactorLevel1",factor_timer_clock,&local_68);
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void reportFactorLevel1Clock(HighsTimerClock& factor_timer_clock) {
    std::vector<HighsInt> factor_clock_list{
        FactorInvertSimple, FactorInvertKernel, FactorInvertDeficient,
        FactorInvertFinish, FactorFtranLower,   FactorFtranUpper,
        FactorBtranLower,   FactorBtranUpper};
    reportFactorClockList("FactorLevel1", factor_timer_clock,
                          factor_clock_list);
  }